

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O0

string * __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
::InMessage::string_abi_cxx11_(string *__return_storage_ptr__,InMessage *this)

{
  buffers_iterator<asio::const_buffers_1,_char> __beg;
  buffers_iterator<asio::const_buffers_1,_char> __end;
  allocator<char> local_a9;
  const_buffer local_a8;
  buffers_iterator<asio::const_buffers_1,_char> local_98;
  const_buffer local_60;
  buffers_iterator<asio::const_buffers_1,_char> local_50;
  InMessage *local_18;
  InMessage *this_local;
  
  local_18 = this;
  this_local = (InMessage *)__return_storage_ptr__;
  local_60 = (const_buffer)
             asio::basic_streambuf<std::allocator<char>_>::data
                       ((basic_streambuf<std::allocator<char>_> *)(this + 0x20));
  asio::buffers_begin<asio::const_buffers_1>(&local_50,(const_buffers_1 *)&local_60);
  local_a8 = (const_buffer)
             asio::basic_streambuf<std::allocator<char>_>::data
                       ((basic_streambuf<std::allocator<char>_> *)(this + 0x20));
  asio::buffers_end<asio::const_buffers_1>(&local_98,(const_buffers_1 *)&local_a8);
  std::allocator<char>::allocator();
  __beg.current_buffer_.size_ = local_50.current_buffer_.size_;
  __beg.current_buffer_.data_ = local_50.current_buffer_.data_;
  __beg.current_buffer_position_ = local_50.current_buffer_position_;
  __beg.begin_ = local_50.begin_;
  __beg.current_ = local_50.current_;
  __beg.end_ = local_50.end_;
  __beg.position_ = local_50.position_;
  __end.current_buffer_.size_ = local_98.current_buffer_.size_;
  __end.current_buffer_.data_ = local_98.current_buffer_.data_;
  __end.current_buffer_position_ = local_98.current_buffer_position_;
  __end.begin_ = local_98.begin_;
  __end.current_ = local_98.current_;
  __end.end_ = local_98.end_;
  __end.position_ = local_98.position_;
  std::__cxx11::string::string<asio::buffers_iterator<asio::const_buffers_1,char>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_a9);
  std::allocator<char>::~allocator(&local_a9);
  return __return_storage_ptr__;
}

Assistant:

std::string string() noexcept {
        return std::string(asio::buffers_begin(streambuf.data()), asio::buffers_end(streambuf.data()));
      }